

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DecorationManager::HaveSubsetOfDecorations
          (DecorationManager *this,uint32_t id1,uint32_t id2)

{
  bool bVar1;
  bool bVar2;
  DecorationSet *in_R9;
  InstructionVector decorations_for2;
  InstructionVector decorations_for1;
  DecorationSet member_decorate_set_for2;
  DecorationSet decorate_string_set_for2;
  DecorationSet decorate_id_set_for2;
  DecorationSet member_decorate_set_for1;
  DecorationSet decorate_string_set_for1;
  DecorationSet decorate_id_set_for1;
  DecorationSet decorate_set_for2;
  DecorationSet decorate_set_for1;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  local_1d8;
  void *local_1c0 [2];
  long local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_1a8;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_178;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_148;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_118;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_e8;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_b8;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_88;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_58;
  
  bVar2 = false;
  InternalGetDecorationsFor<spvtools::opt::Instruction_const*>
            ((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              *)local_1c0,this,id1,false);
  InternalGetDecorationsFor<spvtools::opt::Instruction_const*>(&local_1d8,this,id2,false);
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  HaveSubsetOfDecorations::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_1c0,(InstructionVector *)&local_58,
             (DecorationSet *)&local_b8,(DecorationSet *)&local_e8,(DecorationSet *)&local_118,in_R9
            );
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8._M_impl.super__Rb_tree_header._M_header;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  HaveSubsetOfDecorations::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_1d8,(InstructionVector *)&local_88,
             (DecorationSet *)&local_148,(DecorationSet *)&local_178,(DecorationSet *)&local_1a8,
             in_R9);
  bVar1 = anon_unknown_4::IsSubset((DecorationSet *)&local_58,(DecorationSet *)&local_88);
  if (bVar1) {
    bVar1 = anon_unknown_4::IsSubset((DecorationSet *)&local_b8,(DecorationSet *)&local_148);
    if (bVar1) {
      bVar1 = anon_unknown_4::IsSubset((DecorationSet *)&local_118,(DecorationSet *)&local_1a8);
      if (bVar1) {
        bVar2 = anon_unknown_4::IsSubset((DecorationSet *)&local_e8,(DecorationSet *)&local_178);
        goto LAB_0055a468;
      }
    }
    bVar2 = false;
  }
LAB_0055a468:
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_1a8,(_Link_type)local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_178,(_Link_type)local_178._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_148,(_Link_type)local_148._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_88,(_Link_type)local_88._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_118,(_Link_type)local_118._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_e8,(_Link_type)local_e8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_b8,(_Link_type)local_b8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::_M_erase(&local_58,(_Link_type)local_58._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_1d8.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c0[0] != (void *)0x0) {
    operator_delete(local_1c0[0],local_1b0 - (long)local_1c0[0]);
  }
  return bVar2;
}

Assistant:

bool DecorationManager::HaveSubsetOfDecorations(uint32_t id1,
                                                uint32_t id2) const {
  const InstructionVector decorations_for1 = GetDecorationsFor(id1, false);
  const InstructionVector decorations_for2 = GetDecorationsFor(id2, false);

  // This function splits the decoration instructions into different sets,
  // based on their opcode; only OpDecorate, OpDecorateId,
  // OpDecorateStringGOOGLE, and OpMemberDecorate are considered, the other
  // opcodes are ignored.
  const auto fillDecorationSets =
      [](const InstructionVector& decoration_list, DecorationSet* decorate_set,
         DecorationSet* decorate_id_set, DecorationSet* decorate_string_set,
         DecorationSet* member_decorate_set) {
        for (const Instruction* inst : decoration_list) {
          std::u32string decoration_payload;
          // Ignore the opcode and the target as we do not want them to be
          // compared.
          for (uint32_t i = 1u; i < inst->NumInOperands(); ++i) {
            for (uint32_t word : inst->GetInOperand(i).words) {
              decoration_payload.push_back(word);
            }
          }

          switch (inst->opcode()) {
            case spv::Op::OpDecorate:
              decorate_set->emplace(std::move(decoration_payload));
              break;
            case spv::Op::OpMemberDecorate:
              member_decorate_set->emplace(std::move(decoration_payload));
              break;
            case spv::Op::OpDecorateId:
              decorate_id_set->emplace(std::move(decoration_payload));
              break;
            case spv::Op::OpDecorateStringGOOGLE:
              decorate_string_set->emplace(std::move(decoration_payload));
              break;
            default:
              break;
          }
        }
      };

  DecorationSet decorate_set_for1;
  DecorationSet decorate_id_set_for1;
  DecorationSet decorate_string_set_for1;
  DecorationSet member_decorate_set_for1;
  fillDecorationSets(decorations_for1, &decorate_set_for1,
                     &decorate_id_set_for1, &decorate_string_set_for1,
                     &member_decorate_set_for1);

  DecorationSet decorate_set_for2;
  DecorationSet decorate_id_set_for2;
  DecorationSet decorate_string_set_for2;
  DecorationSet member_decorate_set_for2;
  fillDecorationSets(decorations_for2, &decorate_set_for2,
                     &decorate_id_set_for2, &decorate_string_set_for2,
                     &member_decorate_set_for2);

  const bool result =
      IsSubset(decorate_set_for1, decorate_set_for2) &&
      IsSubset(decorate_id_set_for1, decorate_id_set_for2) &&
      IsSubset(member_decorate_set_for1, member_decorate_set_for2) &&
      // Compare string sets last in case the strings are long.
      IsSubset(decorate_string_set_for1, decorate_string_set_for2);
  return result;
}